

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  ImportInfo *pIVar2;
  string_view str;
  string frameworkName;
  string fileName;
  RegularExpressionMatch match;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    pIVar2 = GetImportInfo(this,config);
    if (pIVar2 == (ImportInfo *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&match);
    }
    else if (pIVar2->NoSOName == true) {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar2->Location);
    }
    else {
      bVar1 = IsFrameworkOnApple(this);
      if (bVar1) {
        memset(&match,0,0xa8);
        bVar1 = cmsys::RegularExpression::find
                          ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                           (pIVar2->SOName)._M_dataplus._M_p,&match);
        if (bVar1) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&frameworkName,&match,2);
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&fileName,&match,3);
          local_50.View_._M_len = frameworkName._M_string_length;
          local_50.View_._M_str = frameworkName._M_dataplus._M_p;
          local_80.View_._M_len = 0xb;
          local_80.View_._M_str = ".framework/";
          cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_50,&local_80,&fileName);
          std::__cxx11::string::~string((string *)&fileName);
          std::__cxx11::string::~string((string *)&frameworkName);
          return __return_storage_ptr__;
        }
      }
      str._M_str = (pIVar2->SOName)._M_dataplus._M_p;
      str._M_len = (pIVar2->SOName)._M_string_length;
      bVar1 = cmHasLiteralPrefix<8ul>(str,(char (*) [8])"@rpath/");
      if (bVar1) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&pIVar2->SOName);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar2->SOName);
      }
    }
  }
  else {
    GetLibraryNames((Names *)&match,this,config);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)match.searchstring == &local_90) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = match.searchstring;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_98;
    local_90._M_local_buf[0] = '\0';
    match.searchstring = (char *)&local_90;
    Names::~Names((Names *)&match);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (this->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(info->SOName.c_str(), match)) {
          auto frameworkName = match.match(2);
          auto fileName = match.match(3);
          return cmStrCat(frameworkName, ".framework/", fileName);
        }
      }
      if (cmHasLiteralPrefix(info->SOName, "@rpath/")) {
        return info->SOName.substr(cmStrLen("@rpath/"));
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}